

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

void __thiscall features::Surf::keypoint_localization_and_filtering(Surf *this)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer pKVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auStack_58 [8];
  Keypoint kp;
  Keypoints filtered_keypoints;
  
  kp.x = 0.0;
  kp.y = 0.0;
  filtered_keypoints.
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>::reserve
            ((vector<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_> *)&kp.x,
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->keypoints).
                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pKVar3 = (this->keypoints).
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pKVar3->octave + lVar4);
      auStack_58 = (undefined1  [8])*puVar1;
      kp._0_8_ = puVar1[1];
      bVar2 = keypoint_localization(this,(Keypoint *)auStack_58);
      if (bVar2) {
        if (filtered_keypoints.
            super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<features::Surf::Keypoint,std::allocator<features::Surf::Keypoint>>::
          _M_realloc_insert<features::Surf::Keypoint_const&>
                    ((vector<features::Surf::Keypoint,std::allocator<features::Surf::Keypoint>> *)
                     &kp.x,(iterator)0x0,(Keypoint *)auStack_58);
        }
        else {
          (filtered_keypoints.
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->octave = auStack_58._0_4_;
          (filtered_keypoints.
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->sample = (float)auStack_58._4_4_;
          (filtered_keypoints.
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->x = (float)kp.octave;
          (filtered_keypoints.
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->y = kp.sample;
          filtered_keypoints.
          super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
          _M_impl.super__Vector_impl_data._M_start =
               filtered_keypoints.
               super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      uVar5 = uVar5 + 1;
      pKVar3 = (this->keypoints).
               super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->keypoints).
                                   super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar3 >> 4));
  }
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)kp._8_8_;
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_finish =
       filtered_keypoints.
       super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->keypoints).
  super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pKVar3 != (pointer)0x0) {
    kp._8_8_ = pKVar3;
    operator_delete(pKVar3);
  }
  return;
}

Assistant:

void
Surf::keypoint_localization_and_filtering (void)
{
    Keypoints filtered_keypoints;
    filtered_keypoints.reserve(this->keypoints.size());
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint kp = this->keypoints[i];
        bool solve_good = this->keypoint_localization(&kp);
        if (!solve_good)
            continue;
        filtered_keypoints.push_back(kp);
    }
    std::swap(this->keypoints, filtered_keypoints);
}